

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

void __thiscall
Clasp::DefaultUnfoundedCheck::RemoveSource::operator()(RemoveSource *this,NodeId bodyId,uint32 idx)

{
  DefaultUnfoundedCheck *pDVar1;
  pointer pBVar2;
  ExtData *this_00;
  NodeId w;
  BodyPtr local_28;
  
  pDVar1 = this->self;
  pBVar2 = (pDVar1->graph_->bodies_).ebo_.buf;
  local_28.node = pBVar2 + bodyId;
  this_00 = (pDVar1->extended_).ebo_.buf[(pDVar1->bodies_).ebo_.buf[bodyId].lower_or_ext];
  if ((pBVar2[bodyId].super_Node.field_0x7 & 0x20) == 0) {
    w = 1;
  }
  else {
    w = ((local_28.node)->super_Node).sep_[(ulong)(idx * 2) + 1];
  }
  local_28.id = bodyId;
  ExtData::removeFromWs(this_00,idx,w);
  if ((0 < this_00->lower) && (((ulong)(this->self->bodies_).ebo_.buf[bodyId] & 0x7fffffff) != 0)) {
    forwardUnsource(this->self,&local_28,true);
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::RemoveSource::operator()(NodeId bodyId, uint32 idx) const {
	BodyPtr n(self->getBody(bodyId));
	ExtData* ext = self->extended_[self->bodies_[bodyId].lower_or_ext];
	ext->removeFromWs(idx, n.node->pred_weight(idx, false));
	if (ext->lower > 0 && self->bodies_[n.id].watches > 0) {
		// extended bodies don't always become false if a predecessor becomes false
		// eagerly enqueue all successors watching this body
		self->forwardUnsource(n, true);
	}
}